

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_operators.cpp
# Opt level: O1

bool __thiscall
duckdb::TryCast::Operation<duckdb::string_t,unsigned_char>
          (TryCast *this,string_t input,uint8_t *result,bool strict)

{
  byte bVar1;
  byte bVar2;
  bool bVar3;
  idx_t pos;
  long lVar4;
  undefined4 uVar5;
  int iVar6;
  int iVar7;
  byte *pbVar8;
  uint uVar9;
  ulong uVar10;
  idx_t iVar11;
  byte bVar12;
  TryCast *pTVar13;
  ulong uVar14;
  char *pcVar15;
  ulong uVar16;
  char cVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  byte bVar22;
  ulong uVar23;
  bool bVar24;
  IntegerCastData<short> local_76;
  undefined4 local_74;
  byte *local_70;
  IntegerDecimalCastData<unsigned_char> local_68;
  ulong local_50;
  ulong local_48;
  string_t input_local;
  
  pbVar8 = input.value._8_8_;
  uVar5 = SUB84(result,0);
  pcVar15 = input.value._0_8_;
  if (((ulong)this & 0xffffffff) < 0xd) {
    pcVar15 = input_local.value.pointer.prefix;
  }
  input_local.value.pointer.ptr = input.value._0_8_;
  uVar16 = (ulong)this & 0xffffffff;
  local_74._0_1_ = (byte)result;
  pTVar13 = this;
  if (uVar16 != 0) {
    iVar6 = 3;
    uVar10 = 0;
    do {
      bVar2 = pcVar15[uVar10];
      pTVar13 = (TryCast *)(ulong)(bVar2 - 9);
      if ((4 < bVar2 - 9) && (bVar2 != 0x20)) {
        if (bVar2 == 0x2d) {
          uVar21 = uVar16 - uVar10;
          uVar14 = 1;
          goto LAB_00ce2f9d;
        }
        if (bVar2 == 0x30 && uVar16 - 1 != uVar10) {
          cVar17 = pcVar15[uVar10 + 1];
          local_70 = (byte *)~uVar10;
          if (cVar17 != 'B') {
            if (cVar17 != 'x') {
              if (cVar17 == 'b') goto LAB_00ce336d;
              if (cVar17 != 'X') {
                bVar12 = 0;
                bVar24 = false;
                if (((byte)local_74 & (byte)(cVar17 - 0x30U) < 10) == 0) goto LAB_00ce352f;
                goto LAB_00ce2fbd;
              }
            }
            local_70 = (byte *)((long)local_70 + uVar16);
            bVar12 = 0;
            bVar2 = 0;
            uVar14 = 1;
            goto LAB_00ce3068;
          }
LAB_00ce336d:
          bVar24 = 1 < (long)local_70 + uVar16;
          if (!bVar24) {
            bVar12 = 0;
            goto LAB_00ce2fbd;
          }
          uVar14 = 1;
          bVar12 = 0;
          goto LAB_00ce338c;
        }
LAB_00ce352f:
        bVar12 = 0;
        bVar24 = false;
        if (((byte)local_74 & bVar2 == 0x2b) != 0) goto LAB_00ce2fbd;
        local_70 = (byte *)(uVar16 - uVar10);
        local_50 = (ulong)(bVar2 == 0x2b);
        bVar12 = 0;
        bVar2 = 0;
        uVar14 = local_50;
        goto LAB_00ce3561;
      }
      uVar10 = uVar10 + 1;
    } while (uVar16 != uVar10);
  }
  bVar12 = (byte)pTVar13;
  bVar24 = false;
  goto LAB_00ce2fbd;
  while (lVar4 = uVar10 + uVar14, uVar14 = uVar14 + 1, pcVar15[lVar4] == '0') {
LAB_00ce2f9d:
    if (uVar21 <= uVar14) {
      uVar14 = 1;
      bVar12 = 0;
      goto LAB_00ce31a3;
    }
  }
  bVar12 = 0;
LAB_00ce2fb5:
  bVar24 = false;
  goto LAB_00ce2fbd;
  while( true ) {
    bVar3 = true;
    uVar23 = uVar14 + 1;
    if ((~uVar14 + uVar16 != uVar10) && (pcVar15[uVar10 + 1 + uVar14] == '_' && (byte)local_74 == 0)
       ) {
      uVar23 = uVar14 + 2;
      if ((uVar16 - uVar14) - 2 == uVar10) {
        bVar3 = false;
      }
      else {
        bVar3 = (byte)(pcVar15[uVar10 + uVar23] - 0x30U) < 10;
      }
    }
    uVar14 = uVar23;
    bVar12 = bVar12 * '\n' - bVar2;
    bVar24 = false;
    if (!bVar3) break;
LAB_00ce31a3:
    if (uVar21 <= uVar14) goto LAB_00ce340b;
    bVar2 = pcVar15[uVar10 + uVar14] - 0x30;
    if (9 < bVar2) {
      if (pcVar15[uVar10 + uVar14] == '.') {
        if ((byte)local_74 != 0) goto LAB_00ce2fb5;
        uVar23 = uVar14 + 1;
        if (uVar23 < uVar21) {
          iVar6 = 0;
          if (9 < (byte)(pcVar15[uVar10 + 1 + uVar14] - 0x30U)) goto LAB_00ce3b4d;
          iVar7 = 1;
        }
        else {
          iVar6 = 3;
LAB_00ce3b4d:
          iVar7 = 1;
          if (1 < uVar14) {
            iVar7 = iVar6;
          }
        }
        uVar14 = uVar23;
        if (iVar7 == 3) goto LAB_00ce340b;
        if (iVar7 != 0) goto LAB_00ce2fb5;
      }
      bVar24 = false;
      if (((ulong)(byte)pcVar15[uVar10 + uVar14] < 0x21) &&
         ((0x100003e00U >> ((ulong)(byte)pcVar15[uVar10 + uVar14] & 0x3f) & 1) != 0)) {
        uVar23 = uVar14 + 1;
        uVar14 = uVar23;
        if (uVar21 <= uVar23) goto LAB_00ce340b;
        goto LAB_00ce367e;
      }
      break;
    }
  }
  goto LAB_00ce2fbd;
  while (uVar23 = uVar23 + 1, uVar14 = uVar21, uVar21 != uVar23) {
LAB_00ce367e:
    if ((0x20 < (ulong)(byte)pcVar15[uVar10 + uVar23]) ||
       ((0x100003e00U >> ((ulong)(byte)pcVar15[uVar10 + uVar23] & 0x3f) & 1) == 0))
    goto LAB_00ce2fb5;
  }
LAB_00ce340b:
  bVar24 = 1 < uVar14;
  goto LAB_00ce2fbd;
LAB_00ce3068:
  do {
    if (local_70 <= uVar14) goto LAB_00ce340b;
    bVar1 = pcVar15[uVar10 + 1 + uVar14];
    bVar22 = bVar1 | 0x20;
    if (0x19 < (byte)(bVar1 + 0xbf)) {
      bVar22 = bVar1;
    }
    if (9 < (byte)(bVar22 - 0x30)) {
      bVar24 = false;
      if ((0x25 < bVar22 - 0x41) || ((0x3f0000003fU >> ((ulong)(bVar22 - 0x41) & 0x3f) & 1) == 0))
      break;
    }
    cVar17 = -0x57;
    if ((char)bVar22 < 'a') {
      cVar17 = -0x30;
    }
    uVar21 = uVar14 + 1;
    if (((uVar16 - uVar14) - 2 == uVar10) || (pcVar15[uVar10 + 2 + uVar14] != '_')) {
LAB_00ce3124:
      bVar3 = bVar2 <= (byte)~(cVar17 + bVar22) >> 4;
      if (bVar3) {
        bVar2 = cVar17 + bVar22 + bVar2 * '\x10';
        bVar12 = bVar2;
      }
    }
    else {
      uVar21 = uVar14 + 2;
      if ((uVar16 - uVar14) - 3 != uVar10) {
        if (9 < (byte)(pcVar15[uVar10 + 3 + uVar14] - 0x30U)) {
          bVar3 = false;
          uVar9 = (byte)pcVar15[uVar10 + 3 + uVar14] - 0x41;
          if ((0x25 < uVar9) || ((0x3f0000003fU >> ((ulong)uVar9 & 0x3f) & 1) == 0))
          goto LAB_00ce3147;
        }
        goto LAB_00ce3124;
      }
      bVar3 = false;
    }
LAB_00ce3147:
    bVar24 = false;
    uVar14 = uVar21;
  } while (bVar3);
  goto LAB_00ce2fbd;
LAB_00ce338c:
  do {
    bVar2 = 0;
    if (pcVar15[uVar10 + 1 + uVar14] != '0') {
      if (pcVar15[uVar10 + 1 + uVar14] == '1') {
        bVar2 = 1;
        goto LAB_00ce33a8;
      }
LAB_00ce3767:
      bVar24 = false;
      break;
    }
LAB_00ce33a8:
    uVar21 = uVar14 + 1;
    if (((uVar16 - uVar14) - 2 != uVar10) && (pcVar15[uVar10 + 2 + uVar14] == '_')) {
      if (((uVar16 - uVar14) - 3 == uVar10) || ((pcVar15[uVar10 + 3 + uVar14] & 0xfeU) != 0x30))
      goto LAB_00ce3767;
      uVar21 = uVar14 + 2;
    }
    uVar14 = uVar21;
    if ((char)bVar12 < '\0') goto LAB_00ce3767;
    bVar12 = bVar2 | bVar12 * '\x02';
    bVar24 = true;
  } while (uVar14 < (long)local_70 + uVar16);
  goto LAB_00ce2fbd;
  while( true ) {
    uVar21 = uVar14 + 1;
    if ((byte)(0x2fU - cVar17) / 10 < bVar2) {
      bVar3 = false;
    }
    else {
      bVar2 = (cVar17 - 0x30U) + bVar2 * '\n';
      bVar3 = true;
      bVar12 = bVar2;
      if ((~uVar14 + uVar16 != uVar10) &&
         (pcVar15[uVar10 + 1 + uVar14] == '_' && (byte)local_74 == 0)) {
        uVar21 = uVar14 + 2;
        if ((uVar16 - uVar14) - 2 == uVar10) {
          bVar3 = false;
        }
        else {
          bVar3 = (byte)(pcVar15[uVar10 + uVar21] - 0x30U) < 10;
        }
      }
    }
    bVar24 = false;
    uVar14 = uVar21;
    if (!bVar3) break;
LAB_00ce3561:
    if (local_70 <= uVar14) goto LAB_00ce3621;
    cVar17 = pcVar15[uVar10 + uVar14];
    if (9 < (byte)(cVar17 - 0x30U)) {
      if (cVar17 == '.') {
        if ((byte)local_74 != 0) {
          bVar24 = false;
          break;
        }
        uVar21 = uVar14 + 1;
        if ((uVar21 < local_70) && (iVar6 = 0, (byte)(pcVar15[uVar10 + 1 + uVar14] - 0x30U) < 10)) {
          iVar7 = 1;
        }
        else {
          iVar7 = 1;
          if (local_50 < uVar14) {
            iVar7 = iVar6;
          }
        }
        uVar14 = uVar21;
        if (iVar7 == 3) goto LAB_00ce3621;
        if (iVar7 != 0) goto LAB_00ce2fb5;
      }
      bVar24 = false;
      if (((ulong)(byte)pcVar15[uVar10 + uVar14] < 0x21) &&
         ((0x100003e00U >> ((ulong)(byte)pcVar15[uVar10 + uVar14] & 0x3f) & 1) != 0)) {
        uVar21 = uVar14 + 1;
        uVar14 = uVar21;
        if (local_70 <= uVar21) goto LAB_00ce3621;
        goto LAB_00ce38b6;
      }
      break;
    }
  }
  goto LAB_00ce2fbd;
  while (lVar4 = uVar10 + uVar21, uVar21 = uVar21 + 1, pcVar15[lVar4] == '0') {
LAB_00ce3182:
    if (uVar14 <= uVar21) {
      local_68.result = 0;
      uVar21 = 1;
      goto LAB_00ce345e;
    }
  }
  goto LAB_00ce2ff5;
  while( true ) {
    uVar23 = uVar21 + 1;
    if (local_68.result < (long)((ulong)bVar2 + 0x8000000000000000) / 10) {
      bVar24 = false;
    }
    else {
      local_68.result = local_68.result * 10 - (ulong)bVar2;
      bVar24 = true;
      if ((~uVar21 + uVar16 != uVar10) &&
         (pcVar15[uVar10 + 1 + uVar21] == '_' && (byte)local_74 == 0)) {
        uVar23 = uVar21 + 2;
        if ((uVar16 - uVar21) - 2 == uVar10) {
          bVar24 = false;
        }
        else {
          bVar24 = (byte)(pcVar15[uVar10 + uVar23] - 0x30U) < 10;
        }
      }
    }
    uVar21 = uVar23;
    if (!bVar24) break;
LAB_00ce345e:
    if (uVar14 <= uVar21) goto LAB_00ce377a;
    bVar2 = pcVar15[uVar10 + uVar21] - 0x30;
    if (9 < bVar2) {
      if (pcVar15[uVar10 + uVar21] != '.') goto LAB_00ce3adf;
      if ((byte)local_74 == 0) {
        uVar23 = uVar21 + 1;
        if (uVar14 <= uVar23) {
          iVar6 = 3;
          uVar18 = uVar23;
          goto LAB_00ce3cf5;
        }
        local_70 = (byte *)0x0;
        uVar19 = uVar23;
        goto LAB_00ce37d9;
      }
      break;
    }
  }
  goto LAB_00ce2ff3;
  while (uVar19 = uVar18, uVar18 < uVar14) {
LAB_00ce37d9:
    bVar2 = pcVar15[uVar10 + uVar19] - 0x30;
    local_50 = uVar23;
    if (9 < bVar2) {
      iVar6 = 0;
      goto LAB_00ce3cdd;
    }
    if ((long)local_70 <= (long)(((ulong)bVar2 ^ 0x7ffffffffffffffe) / 10)) {
      local_68.decimal_digits = local_68.decimal_digits + 1;
      local_70 = (byte *)((long)local_70 * 10 + (ulong)bVar2);
    }
    uVar18 = uVar19 + 1;
    if (((~uVar19 + uVar16 != uVar10) && (pcVar15[uVar10 + 1 + uVar19] == '_')) &&
       ((uVar18 = uVar19 + 2, (uVar16 - uVar19) - 2 == uVar10 ||
        (9 < (byte)(pcVar15[uVar10 + uVar18] - 0x30U))))) {
      local_68._18_6_ = 0;
      local_68.decimal = (StoreType)local_70;
      iVar7 = 1;
      goto LAB_00ce3d0a;
    }
  }
  iVar6 = 3;
LAB_00ce3cdd:
  local_68._18_6_ = 0;
  local_68.decimal = (StoreType)local_70;
  uVar18 = uVar19;
LAB_00ce3cf5:
  iVar7 = 1;
  if (uVar23 < uVar18) {
    iVar7 = iVar6;
  }
  if (1 < uVar21) {
    iVar7 = iVar6;
  }
LAB_00ce3d0a:
  uVar21 = uVar18;
  if (iVar7 == 3) {
LAB_00ce377a:
    bVar24 = IntegerDecimalCastOperation::
             Finalize<duckdb::IntegerDecimalCastData<unsigned_char>,true>(&local_68);
    if (bVar24) {
      bVar24 = 1 < uVar21;
      goto LAB_00ce2ff5;
    }
  }
  else if (iVar7 == 0) {
LAB_00ce3adf:
    bVar2 = pcVar15[uVar10 + uVar21];
    if (bVar2 - 9 < 5) {
LAB_00ce3af3:
      uVar16 = uVar21 + 1;
      uVar21 = uVar16;
      if (uVar16 < uVar14) {
        do {
          if ((0x20 < (ulong)(byte)pcVar15[uVar10 + uVar16]) ||
             ((0x100003e00U >> ((ulong)(byte)pcVar15[uVar10 + uVar16] & 0x3f) & 1) == 0))
          goto LAB_00ce2ff3;
          uVar16 = uVar16 + 1;
          uVar21 = uVar14;
        } while (uVar14 != uVar16);
      }
      goto LAB_00ce377a;
    }
    if ((bVar2 == 0x65) || (bVar2 == 0x45)) {
      if ((uVar21 != 1 && (byte)local_74 == 0) && (uVar21 + 1 < uVar14)) {
        local_76.result = 0;
        pcVar15 = pcVar15 + uVar10 + uVar21 + 1;
        iVar11 = ~uVar10 + (uVar16 - uVar21);
        if (*pcVar15 == '-') {
          bVar3 = IntegerCastLoop<duckdb::IntegerCastData<short>,true,false,duckdb::IntegerCastOperation,(char)46>
                            (pcVar15,iVar11,&local_76,false);
        }
        else {
          bVar3 = IntegerCastLoop<duckdb::IntegerCastData<short>,false,false,duckdb::IntegerCastOperation,(char)46>
                            (pcVar15,iVar11,&local_76,false);
        }
        bVar24 = false;
        if (bVar3 != false) {
          bVar24 = IntegerDecimalCastOperation::
                   HandleExponent<duckdb::IntegerDecimalCastData<unsigned_char>,true>
                             (&local_68,local_76.result);
        }
        goto LAB_00ce2ff5;
      }
    }
    else if (bVar2 == 0x20) goto LAB_00ce3af3;
  }
  goto LAB_00ce2ff3;
  while( true ) {
    uVar21 = uVar19;
    if (0x3fffffffffffffff < local_68.result) goto LAB_00ce2ff3;
    local_68.result = uVar23 + local_68.result * 2;
    if (uVar14 <= uVar21) break;
LAB_00ce36d2:
    if (pcVar15[uVar10 + 1 + uVar21] == '0') {
      uVar23 = 0;
    }
    else {
      uVar23 = 1;
      if (pcVar15[uVar10 + 1 + uVar21] != '1') goto LAB_00ce2ff3;
    }
    uVar19 = uVar21 + 1;
    if (((uVar16 - uVar21) - 2 != uVar10) && (pcVar15[uVar10 + 2 + uVar21] == '_')) {
      if (((uVar16 - uVar21) - 3 == uVar10) || ((pcVar15[uVar10 + 3 + uVar21] & 0xfeU) != 0x30))
      goto LAB_00ce2ff3;
      uVar19 = uVar21 + 2;
    }
  }
LAB_00ce374c:
  bVar24 = IntegerDecimalCastOperation::
           Finalize<duckdb::IntegerDecimalCastData<unsigned_char>,false>(&local_68);
  bVar24 = bVar24 && 1 < uVar14;
  goto LAB_00ce2ff5;
LAB_00ce3284:
  do {
    if (~uVar10 + uVar16 <= uVar14) {
      bVar24 = IntegerDecimalCastOperation::
               Finalize<duckdb::IntegerDecimalCastData<unsigned_char>,false>(&local_68);
      bVar24 = 1 < uVar14 && bVar24;
      goto LAB_00ce2ff5;
    }
    bVar2 = pcVar15[uVar10 + 1 + uVar14];
    bVar12 = bVar2 | 0x20;
    if (0x19 < (byte)(bVar2 + 0xbf)) {
      bVar12 = bVar2;
    }
    if ((9 < (byte)(bVar12 - 0x30)) &&
       ((0x25 < bVar12 - 0x41 || ((0x3f0000003fU >> ((ulong)(bVar12 - 0x41) & 0x3f) & 1) == 0))))
    break;
    cVar17 = -0x57;
    if ((char)bVar12 < 'a') {
      cVar17 = -0x30;
    }
    uVar21 = uVar14 + 1;
    if (((uVar16 - uVar14) - 2 == uVar10) || (pcVar15[uVar10 + 2 + uVar14] != '_')) {
LAB_00ce3337:
      uVar14 = (ulong)((byte)(cVar17 + bVar12) >> 4) ^ 0x7ffffffffffffff;
      lVar4 = local_68.result;
      if (local_68.result <= (long)uVar14) {
        lVar4 = local_68.result * 0x10 + (ulong)(byte)(cVar17 + bVar12);
      }
      bVar24 = local_68.result <= (long)uVar14;
      local_68.result = lVar4;
    }
    else {
      uVar21 = uVar14 + 2;
      if ((uVar16 - uVar14) - 3 != uVar10) {
        if (9 < (byte)(pcVar15[uVar10 + 3 + uVar14] - 0x30U)) {
          uVar9 = (byte)pcVar15[uVar10 + 3 + uVar14] - 0x41;
          bVar24 = false;
          if ((0x25 < uVar9) || (bVar24 = false, (0x3f0000003fU >> ((ulong)uVar9 & 0x3f) & 1) == 0))
          goto LAB_00ce335b;
        }
        goto LAB_00ce3337;
      }
      bVar24 = false;
    }
LAB_00ce335b:
    uVar14 = uVar21;
  } while (bVar24);
  goto LAB_00ce2ff3;
  while( true ) {
    bVar2 = pcVar15[uVar10 + uVar21] - 0x30;
    if (9 < bVar2) {
      if (pcVar15[uVar10 + uVar21] != '.') goto LAB_00ce3baa;
      if ((byte)local_74 != 0) goto LAB_00ce2ff3;
      uVar19 = uVar21 + 1;
      if (uVar14 <= uVar19) {
        iVar6 = 3;
        uVar20 = uVar19;
        goto LAB_00ce3d35;
      }
      local_68.decimal = 0;
      uVar18 = uVar19;
      goto LAB_00ce3a4b;
    }
    uVar19 = uVar21 + 1;
    bVar24 = false;
    if (local_68.result <= (long)(((ulong)bVar2 ^ 0x7ffffffffffffffe) / 10)) {
      local_68.result = local_68.result * 10 + (ulong)bVar2;
      bVar24 = true;
      if ((~uVar21 + uVar16 != uVar10) &&
         (pcVar15[uVar10 + 1 + uVar21] == '_' && (byte)local_74 == 0)) {
        uVar19 = uVar21 + 2;
        if ((uVar16 - uVar21) - 2 == uVar10) {
          bVar24 = false;
        }
        else {
          bVar24 = (byte)(pcVar15[uVar10 + uVar19] - 0x30U) < 10;
        }
      }
    }
    uVar21 = uVar19;
    if (!bVar24) break;
LAB_00ce3927:
    local_70 = pbVar8;
    local_50 = uVar23;
    if (uVar14 <= uVar21) goto LAB_00ce39ef;
  }
  goto LAB_00ce3d5d;
  while (uVar18 = uVar20, uVar20 < uVar14) {
LAB_00ce3a4b:
    bVar2 = pcVar15[uVar10 + uVar18] - 0x30;
    local_48 = uVar19;
    if (9 < bVar2) {
      iVar6 = 0;
      goto LAB_00ce3d25;
    }
    if (local_68.decimal <= (long)(((ulong)bVar2 ^ 0x7ffffffffffffffe) / 10)) {
      local_68.decimal_digits = local_68.decimal_digits + 1;
      local_68.decimal = local_68.decimal * 10 + (ulong)bVar2;
    }
    uVar20 = uVar18 + 1;
    if (((~uVar18 + uVar16 != uVar10) && (pcVar15[uVar10 + 1 + uVar18] == '_')) &&
       ((uVar20 = uVar18 + 2, (uVar16 - uVar18) - 2 == uVar10 ||
        (9 < (byte)(pcVar15[uVar10 + uVar20] - 0x30U))))) {
      local_68._18_6_ = 0;
      iVar7 = 1;
      goto LAB_00ce3d4c;
    }
  }
  iVar6 = 3;
LAB_00ce3d25:
  local_68._18_6_ = 0;
  uVar20 = uVar18;
LAB_00ce3d35:
  iVar7 = 1;
  if (uVar19 < uVar20) {
    iVar7 = iVar6;
  }
  if (uVar23 < uVar21) {
    iVar7 = iVar6;
  }
LAB_00ce3d4c:
  uVar21 = uVar20;
  if (iVar7 == 3) {
LAB_00ce39ef:
    bVar24 = IntegerDecimalCastOperation::
             Finalize<duckdb::IntegerDecimalCastData<unsigned_char>,false>(&local_68);
    if (bVar24) {
      bVar24 = uVar23 < uVar21;
      pbVar8 = local_70;
      goto LAB_00ce2ff5;
    }
  }
  else if (iVar7 == 0) {
LAB_00ce3baa:
    bVar2 = pcVar15[uVar10 + uVar21];
    if (bVar2 - 9 < 5) {
LAB_00ce3bba:
      uVar16 = uVar21 + 1;
      uVar21 = uVar16;
      if (uVar16 < uVar14) {
        do {
          if ((0x20 < (ulong)(byte)pcVar15[uVar10 + uVar16]) ||
             ((0x100003e00U >> ((ulong)(byte)pcVar15[uVar10 + uVar16] & 0x3f) & 1) == 0))
          goto LAB_00ce3d5d;
          uVar16 = uVar16 + 1;
          uVar21 = uVar14;
        } while (uVar14 != uVar16);
      }
      goto LAB_00ce39ef;
    }
    if ((bVar2 == 0x65) || (bVar2 == 0x45)) {
      if ((uVar21 != uVar23 && (byte)local_74 == 0) && (uVar21 + 1 < uVar14)) {
        local_76.result = 0;
        pcVar15 = pcVar15 + uVar10 + uVar21 + 1;
        iVar11 = ~uVar10 + (uVar16 - uVar21);
        if (*pcVar15 == '-') {
          bVar3 = IntegerCastLoop<duckdb::IntegerCastData<short>,true,false,duckdb::IntegerCastOperation,(char)46>
                            (pcVar15,iVar11,&local_76,false);
        }
        else {
          bVar3 = IntegerCastLoop<duckdb::IntegerCastData<short>,false,false,duckdb::IntegerCastOperation,(char)46>
                            (pcVar15,iVar11,&local_76,false);
        }
        bVar24 = false;
        pbVar8 = local_70;
        if (bVar3 != false) {
          bVar24 = IntegerDecimalCastOperation::
                   HandleExponent<duckdb::IntegerDecimalCastData<unsigned_char>,false>
                             (&local_68,local_76.result);
          pbVar8 = local_70;
        }
        goto LAB_00ce2ff5;
      }
    }
    else if (bVar2 == 0x20) goto LAB_00ce3bba;
  }
LAB_00ce3d5d:
  bVar24 = false;
  pbVar8 = local_70;
  goto LAB_00ce2ff5;
  while (uVar21 = uVar21 + 1, uVar14 = (ulong)local_70, local_70 != (byte *)uVar21) {
LAB_00ce38b6:
    if ((0x20 < (ulong)(byte)pcVar15[uVar10 + uVar21]) ||
       ((0x100003e00U >> ((ulong)(byte)pcVar15[uVar10 + uVar21] & 0x3f) & 1) == 0))
    goto LAB_00ce2fb5;
  }
LAB_00ce3621:
  bVar24 = local_50 < uVar14;
LAB_00ce2fbd:
  if (bVar24) {
    *pbVar8 = bVar12;
    bVar24 = true;
  }
  else {
    if (uVar16 != 0) {
      uVar10 = 0;
      do {
        bVar2 = pcVar15[uVar10];
        if ((0x20 < (ulong)bVar2) || ((0x100003e00U >> ((ulong)bVar2 & 0x3f) & 1) == 0)) {
          local_68.result = 0;
          local_68.decimal = 0;
          local_68._16_8_ = 0;
          uVar14 = uVar16 - uVar10;
          local_68.decimal_digits = 0;
          local_74 = uVar5;
          input_local.value._0_8_ = this;
          if (bVar2 == 0x2d) {
            bVar24 = false;
            uVar21 = 1;
            goto LAB_00ce3182;
          }
          if (bVar2 == 0x30 && uVar16 - 1 != uVar10) {
            cVar17 = pcVar15[uVar10 + 1];
            if (cVar17 == 'B') {
LAB_00ce36aa:
              uVar14 = ~uVar10 + uVar16;
              if (uVar14 < 2) goto LAB_00ce374c;
              local_68.result = 0;
              uVar21 = 1;
              goto LAB_00ce36d2;
            }
            if (cVar17 != 'x') {
              if (cVar17 == 'b') goto LAB_00ce36aa;
              if (cVar17 != 'X') {
                if (((byte)local_74 & (byte)(cVar17 - 0x30U) < 10) == 0) goto LAB_00ce38f9;
                break;
              }
            }
            local_68.result = 0;
            uVar14 = 1;
            goto LAB_00ce3284;
          }
LAB_00ce38f9:
          if (((byte)local_74 & bVar2 == 0x2b) == 0) {
            uVar23 = (ulong)(bVar2 == 0x2b);
            local_68.result = 0;
            uVar21 = uVar23;
            goto LAB_00ce3927;
          }
          break;
        }
        uVar10 = uVar10 + 1;
      } while (uVar16 != uVar10);
    }
LAB_00ce2ff3:
    bVar24 = false;
LAB_00ce2ff5:
    if (bVar24 != false) {
      *pbVar8 = (byte)local_68.result;
    }
  }
  return bVar24;
}

Assistant:

bool TryCast::Operation(string_t input, uint8_t &result, bool strict) {
	return TrySimpleIntegerCast<uint8_t, false>(input.GetData(), input.GetSize(), result, strict);
}